

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O0

void strbuf_append_string(strbuf_t *s,char *str)

{
  int local_20;
  int local_1c;
  int i;
  int space;
  char *str_local;
  strbuf_t *s_local;
  
  local_1c = strbuf_empty_length(s);
  for (local_20 = 0; str[local_20] != '\0'; local_20 = local_20 + 1) {
    if (local_1c < 1) {
      strbuf_resize(s,s->length + 1);
      local_1c = strbuf_empty_length(s);
    }
    s->buf[s->length] = str[local_20];
    s->length = s->length + 1;
    local_1c = local_1c + -1;
  }
  return;
}

Assistant:

void strbuf_append_string(strbuf_t *s, const char *str)
{
    int space, i;

    space = strbuf_empty_length(s);

    for (i = 0; str[i]; i++) {
        if (space < 1) {
            strbuf_resize(s, s->length + 1);
            space = strbuf_empty_length(s);
        }

        s->buf[s->length] = str[i];
        s->length++;
        space--;
    }
}